

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-light.c
# Opt level: O0

_Bool borg_check_light_only(void)

{
  borg_grid *pbVar1;
  chunk_conflict *pcVar2;
  _Bool _Var3;
  int x_00;
  int y_00;
  loc_conflict lVar4;
  borg_grid *ag_1;
  int local_38;
  int floors;
  int y_1;
  int x_1;
  int y;
  int x;
  borg_grid *ag;
  int local_10;
  int corners;
  int i;
  
  if (borg.trait[0x69] == 0) {
    corners._3_1_ = false;
  }
  else if ((borg.trait[0x70] == 0) && (borg.trait[0x78] == 0)) {
    if (((borg.when_wizard_light == 0) || (999 < (int)borg_t - (int)borg.when_wizard_light)) &&
       ((_Var3 = borg_activate_item(act_clairvoyance), _Var3 ||
        (((_Var3 = borg_activate_item(act_enlightenment), _Var3 ||
          (_Var3 = borg_spell_fail(FUME_OF_MORDOR,0x28), _Var3)) ||
         (_Var3 = borg_spell_fail(CLAIRVOYANCE,0x28), _Var3)))))) {
      borg_note("# Wizard lighting the dungeon");
      borg.when_wizard_light = borg_t;
      corners._3_1_ = true;
    }
    else if (borg.trait[0x19] == 4) {
      corners._3_1_ = borg_check_dark_only();
    }
    else if ((borg.when_call_light == 0) || (6 < (int)borg_t - (int)borg.when_call_light)) {
      if (borg.trait[0x1a] == 1) {
        ag._4_4_ = 0;
        for (local_10 = 4; pcVar2 = cave, local_10 < 8; local_10 = local_10 + 1) {
          x_00 = borg.c.x + ddx_ddd[local_10];
          y_00 = borg.c.y + ddy_ddd[local_10];
          lVar4 = (loc_conflict)loc(x_00,y_00);
          _Var3 = square_in_bounds_fully((chunk *)pcVar2,lVar4);
          if (_Var3) {
            if (borg_grids[y_00][x_00].feat == '\0') {
              ag._4_4_ = ag._4_4_ + 1;
            }
            _Var3 = borg_cave_floor_grid(borg_grids[y_00] + x_00);
            if (!_Var3) {
              ag._4_4_ = ag._4_4_ + 1;
            }
          }
        }
        if (2 < ag._4_4_) {
          return false;
        }
      }
      else if (1 < borg.trait[0x1a]) {
        ag_1._4_4_ = 0;
        for (local_38 = borg.c.y + -2; local_38 <= borg.c.y + 2; local_38 = local_38 + 1) {
          for (floors = borg.c.x + -2; pcVar2 = cave, floors <= borg.c.x + 2; floors = floors + 1) {
            lVar4 = (loc_conflict)loc(floors,local_38);
            _Var3 = square_in_bounds_fully((chunk *)pcVar2,lVar4);
            if (_Var3) {
              pbVar1 = borg_grids[local_38];
              _Var3 = borg_cave_floor_grid(pbVar1 + floors);
              pcVar2 = cave;
              if ((_Var3) && ((pbVar1[floors].info & 0x10) != 0)) {
                lVar4 = (loc_conflict)loc(floors,local_38);
                _Var3 = square_isglow((chunk *)pcVar2,lVar4);
                if (!_Var3) {
                  ag_1._4_4_ = ag_1._4_4_ + 1;
                }
              }
            }
          }
        }
        if (ag_1._4_4_ < 0xb) {
          return false;
        }
      }
      _Var3 = borg_activate_item(act_illumination);
      if (((((_Var3) || (_Var3 = borg_activate_item(act_light), _Var3)) ||
           (_Var3 = borg_zap_rod(sv_rod_illumination), _Var3)) ||
          ((_Var3 = borg_use_staff(sv_staff_light), _Var3 ||
           (_Var3 = borg_read_scroll(sv_scroll_light), _Var3)))) ||
         ((_Var3 = borg_spell_fail(LIGHT_ROOM,0x28), _Var3 ||
          (_Var3 = borg_spell_fail(CALL_LIGHT,0x28), _Var3)))) {
        borg_note("# Illuminating the dungeon");
        borg_react("SELF:lite","SELF:lite");
        borg.when_call_light = borg_t;
        corners._3_1_ = true;
      }
      else {
        corners._3_1_ = false;
      }
    }
    else {
      corners._3_1_ = false;
    }
  }
  else {
    corners._3_1_ = false;
  }
  return corners._3_1_;
}

Assistant:

bool borg_check_light_only(void)
{
    /* Never in town, when blind or when hallucinating */
    if (!borg.trait[BI_CDEPTH])
        return false;
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISIMAGE])
        return false;

    /** Use wizard light sometimes **/
    if (!borg.when_wizard_light || (borg_t - borg.when_wizard_light >= 1000)) {
        if (borg_activate_item(act_clairvoyance)
            || borg_activate_item(act_enlightenment)
            || borg_spell_fail(FUME_OF_MORDOR, 40)
            || borg_spell_fail(CLAIRVOYANCE, 40)) {
            borg_note("# Wizard lighting the dungeon");
            /* borg_react("SELF:wizard lite", "SELF:wizard lite"); */
            borg.when_wizard_light = borg_t;
            return true;
        }
    }

    /* necromancers like the dark */
    if (borg.trait[BI_CLASS] == CLASS_NECROMANCER)
        return borg_check_dark_only();

    /** Work out if there's any reason to light */

    /* Don't bother because we only just did it */
    if (borg.when_call_light != 0 && (borg_t - borg.when_call_light) < 7)
        return false;

    if (borg.trait[BI_LIGHT] == 1) {
        int i;
        int corners = 0;

        /* Scan diagonal neighbors.
         *
         * 4 corners   3 corners    2 corners    1 corner    0 corners
         * ###         ##.  #..     ##.  #..     .#.         .#.  ... .#.
         * .@.         .@.  .@.     .@.  .@.     .@.         #@#  .@. .@.
         * ###         ###  ###     ##.  #..     ##.         .#.  ... .#.
         *
         * There's actually no way to tell which are rooms and which are
         * corridors from diagonals except 4 (always a corridor) and
         * 0 (always a room).  This is why we only use it for radius 1 light.
         */
        for (i = 4; i < 8; i++) {
            borg_grid *ag;

            /* Get location */
            int x = borg.c.x + ddx_ddd[i];
            int y = borg.c.y + ddy_ddd[i];

            /* Bounds check */
            if (!square_in_bounds_fully(cave, loc(x, y)))
                continue;

            /* Get grid */
            ag = &borg_grids[y][x];

            /* Location must be known */
            if (ag->feat == FEAT_NONE)
                corners++;

            /* Location must be a wall/door */
            if (!borg_cave_floor_grid(ag))
                corners++;
        }

        /* This is quite an arbitrary cutoff */
        if (corners > 2)
            return false;
    } else if (borg.trait[BI_LIGHT] > 1) {
        int x, y;
        int floors = 0;

        /*
         * Scan the surrounding 5x5 area for unlit tiles.
         *
         * Radius two light misses out the four corners but otherwise
         * illuminates a 5x5 grid, which is 21 grids illuminated incl player.
         *
         *  ...
         * .....
         * ..@..
         * .....
         *  ...
         */
        for (y = borg.c.y - 2; y <= borg.c.y + 2; y++) {
            for (x = borg.c.x - 2; x <= borg.c.x + 2; x++) {
                borg_grid *ag;

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(x, y)))
                    continue;

                /* Get grid */
                ag = &borg_grids[y][x];

                /* Must be a floor grid lit by torchlight, not by magic */
                if (borg_cave_floor_grid(ag) && (ag->info & BORG_LIGHT)
                    && !square_isglow(cave, loc(x, y))) {
                    floors++;
                }
            }
        }

        /* Don't bother unless there are enough unlit floors */
        /* 11 is the empirical cutoff point for sensible behaviour here */
        if (floors < 11)
            return false;
    }

    /* Light it up! */
    if (borg_activate_item(act_illumination) 
        || borg_activate_item(act_light)
        || borg_zap_rod(sv_rod_illumination) 
        || borg_use_staff(sv_staff_light)
        || borg_read_scroll(sv_scroll_light) 
        || borg_spell_fail(LIGHT_ROOM, 40)
        || borg_spell_fail(CALL_LIGHT, 40)) {
        borg_note("# Illuminating the dungeon");
        borg_react("SELF:lite", "SELF:lite");
        borg.when_call_light = borg_t;
        return true;
    }

    return false;
}